

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O2

void wasm_trap_message(wasm_trap_t *trap,wasm_message_t *out)

{
  Trap *pTVar1;
  wasm_byte_vec_t local_48;
  wasm_byte_t *local_38;
  long local_30;
  
  if (trap != (wasm_trap_t *)0x0) {
    pTVar1 = wasm_ref_t::As<wabt::interp::Trap>(&trap->super_wasm_ref_t);
    std::__cxx11::string::string((string *)&local_38,(string *)&pTVar1->message_);
    wasm_byte_vec_new(&local_48,local_30 + 1,local_38);
    out->size = local_48.size;
    out->data = local_48.data;
    std::__cxx11::string::_M_dispose();
    return;
  }
  __assert_fail("trap",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/interp/interp-wasm-c-api.cc"
                ,0x236,"void wasm_trap_message(const wasm_trap_t *, wasm_message_t *)");
}

Assistant:

void wasm_trap_message(const wasm_trap_t* trap, own wasm_message_t* out) {
  assert(trap);
  *out = FromString(trap->As<Trap>()->message());
}